

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void store_delete(store *s,object *obj,wchar_t amt)

{
  object *known_obj;
  object *local_20;
  object *local_18;
  
  local_20 = obj->known;
  if (amt < (int)(uint)obj->number) {
    obj->number = obj->number - (char)amt;
    local_20->number = local_20->number - (char)amt;
  }
  else {
    local_18 = obj;
    pile_excise(&s->stock,obj);
    object_delete((chunk *)0x0,(chunk *)0x0,&local_18);
    pile_excise(&s->stock_k,local_20);
    object_delete((chunk *)0x0,(chunk *)0x0,&local_20);
    if (s->stock_num == '\0') {
      __assert_fail("s->stock_num",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                    ,0x4c4,"void store_delete(struct store *, struct object *, int)");
    }
    s->stock_num = s->stock_num + 0xff;
  }
  return;
}

Assistant:

static void store_delete(struct store *s, struct object *obj, int amt)
{
	struct object *known_obj = obj->known;

	if (obj->number > amt) {
		obj->number -= amt;
		known_obj->number -= amt;
	} else {
		pile_excise(&s->stock, obj);
		object_delete(NULL, NULL, &obj);
		pile_excise(&s->stock_k, known_obj);
		object_delete(NULL, NULL, &known_obj);
		assert(s->stock_num);
		s->stock_num--;
	}
}